

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KryoFlux.cpp
# Opt level: O2

int __thiscall KryoFlux::SelectSide(KryoFlux *this,int head)

{
  int iVar1;
  string local_30;
  
  (**(code **)(*(long *)this + 0x18))(&local_30,this,9,head,0);
  iVar1 = ResponseCode(&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return iVar1;
}

Assistant:

int KryoFlux::SelectSide(int head)
{
    return ResponseCode(Control(REQ_SIDE, head));
}